

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O2

void __thiscall duckdb::BuiltinFunctions::RegisterExtensionOverloads(BuiltinFunctions *this)

{
  pointer pVVar1;
  LogicalType varargs;
  bool bVar2;
  char *params;
  reference pvVar3;
  vector<duckdb::Value,_true> *pvVar4;
  long lVar5;
  InternalException *this_00;
  pointer this_01;
  undefined4 in_stack_fffffffffffffb0c;
  undefined4 in_stack_fffffffffffffb14;
  char *pcVar6;
  vector<duckdb::LogicalType,_true> arguments;
  LogicalType return_type;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_498;
  LogicalType local_480;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  ScalarFunctionSet current_set;
  _Any_data local_418;
  undefined8 local_408;
  undefined8 uStack_400;
  LogicalType local_3f8;
  string local_3e0;
  string local_3c0;
  FunctionSet<duckdb::ScalarFunction> local_3a0;
  LogicalType local_368;
  Value parameters;
  string local_310;
  FunctionSet<duckdb::ScalarFunction> local_2f0;
  FunctionSet<duckdb::ScalarFunction> local_2b8;
  ScalarFunction function;
  ScalarFunction local_158;
  
  ScalarFunctionSet::ScalarFunctionSet(&current_set);
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 0x99cc) {
      FunctionSet<duckdb::ScalarFunction>::FunctionSet
                (&local_2f0,&current_set.super_FunctionSet<duckdb::ScalarFunction>);
      AddExtensionFunction(this,(ScalarFunctionSet *)&local_2f0);
      FunctionSet<duckdb::ScalarFunction>::~FunctionSet(&local_2f0);
      FunctionSet<duckdb::ScalarFunction>::~FunctionSet
                (&current_set.super_FunctionSet<duckdb::ScalarFunction>);
      return;
    }
    params = &EXTENSION_FUNCTION_OVERLOADS + lVar5;
    arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::__cxx11::string::string
              ((string *)&function,"[TIMESTAMP]>INTERVAL" + lVar5,(allocator *)&local_3a0);
    ::std::__cxx11::string::string((string *)&parameters,">",(allocator *)&return_type);
    StringUtil::Split(&splits,(string *)&function,(string *)&parameters);
    ::std::__cxx11::string::~string((string *)&parameters);
    ::std::__cxx11::string::~string((string *)&function);
    pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&splits,1);
    DBConfig::ParseLogicalType(&return_type,pvVar3);
    pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&splits,0);
    ::std::__cxx11::string::string((string *)&local_3c0,(string *)pvVar3);
    Value::Value((Value *)&function,&local_3c0);
    LogicalType::LogicalType(&local_480,VARCHAR);
    LogicalType::LIST((LogicalType *)&local_3a0,&local_480);
    Value::DefaultCastAs(&parameters,(Value *)&function,(LogicalType *)&local_3a0,false);
    LogicalType::~LogicalType((LogicalType *)&local_3a0);
    LogicalType::~LogicalType(&local_480);
    Value::~Value((Value *)&function);
    ::std::__cxx11::string::~string((string *)&local_3c0);
    pvVar4 = ListValue::GetChildren(&parameters);
    pVVar1 = (pvVar4->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_01 = (pvVar4->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_start; this_01 != pVVar1; this_01 = this_01 + 1) {
      Value::GetValue<std::__cxx11::string>((string *)&function,this_01);
      DBConfig::ParseLogicalType((LogicalType *)&local_3a0,(string *)&function);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
      emplace_back<duckdb::LogicalType>
                (&arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (LogicalType *)&local_3a0);
      LogicalType::~LogicalType((LogicalType *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&function);
    }
    if (params[0x60] != '\x1a') break;
    ::std::__cxx11::string::string((string *)&local_3e0,params,(allocator *)&local_3a0);
    local_498.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_498.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_498.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LogicalType::LogicalType(&local_3f8,&return_type);
    local_408 = 0;
    uStack_400 = 0;
    local_418._M_unused._M_object = (void *)0x0;
    local_418._8_8_ = 0;
    LogicalType::LogicalType(&local_368,INVALID);
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    varargs._0_8_ = &local_368;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
         in_stack_fffffffffffffb0c;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         0;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         in_stack_fffffffffffffb14;
    ScalarFunction::ScalarFunction
              (&function,&local_3e0,(vector<duckdb::LogicalType,_true> *)&local_498,&local_3f8,
               (scalar_function_t *)&local_418,BindExtensionFunction,
               (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
               (init_local_state_t)0x0,varargs,CONSISTENT,(FunctionNullHandling)params,
               (bind_lambda_function_t)
               arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start);
    LogicalType::~LogicalType(&local_368);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_418);
    LogicalType::~LogicalType(&local_3f8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_498);
    ::std::__cxx11::string::~string((string *)&local_3e0);
    pcVar6 = params;
    make_shared_ptr<duckdb::ExtensionFunctionInfo,char_const(&)[48]>((char (*) [48])&local_3a0);
    shared_ptr<duckdb::ScalarFunctionInfo,_true>::operator=<duckdb::ExtensionFunctionInfo,_0>
              (&function.function_info,(shared_ptr<duckdb::ExtensionFunctionInfo,_true> *)&local_3a0
              );
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_3a0.name._M_string_length);
    bVar2 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &current_set,params);
    if (bVar2) {
      if (current_set.super_FunctionSet<duckdb::ScalarFunction>.name._M_string_length != 0) {
        FunctionSet<duckdb::ScalarFunction>::FunctionSet
                  (&local_2b8,&current_set.super_FunctionSet<duckdb::ScalarFunction>);
        AddExtensionFunction(this,(ScalarFunctionSet *)&local_2b8);
        FunctionSet<duckdb::ScalarFunction>::~FunctionSet(&local_2b8);
      }
      ::std::__cxx11::string::string((string *)&local_310,pcVar6,(allocator *)&local_480);
      ScalarFunctionSet::ScalarFunctionSet((ScalarFunctionSet *)&local_3a0,&local_310);
      FunctionSet<duckdb::ScalarFunction>::operator=
                (&current_set.super_FunctionSet<duckdb::ScalarFunction>,&local_3a0);
      FunctionSet<duckdb::ScalarFunction>::~FunctionSet(&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_310);
    }
    ScalarFunction::ScalarFunction(&local_158,&function);
    ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
    emplace_back<duckdb::ScalarFunction>
              (&current_set.super_FunctionSet<duckdb::ScalarFunction>.functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
               &local_158);
    ScalarFunction::~ScalarFunction(&local_158);
    ScalarFunction::~ScalarFunction(&function);
    Value::~Value(&parameters);
    LogicalType::~LogicalType(&return_type);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&splits);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    lVar5 = lVar5 + 0xc1;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&function,
             "Extension function overloads only supported for scalar functions currently - %s has a different type"
             ,(allocator *)&local_3a0);
  InternalException::InternalException<char_const*>(this_00,(string *)&function,params);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BuiltinFunctions::RegisterExtensionOverloads() {
#ifdef GENERATE_EXTENSION_ENTRIES
	// do not insert auto loading placeholders when generating extension entries
	return;
#endif
	ScalarFunctionSet current_set;
	for (auto &entry : EXTENSION_FUNCTION_OVERLOADS) {
		vector<LogicalType> arguments;
		auto splits = StringUtil::Split(entry.signature, ">");
		auto return_type = DBConfig::ParseLogicalType(splits[1]);
		auto parameters = Value(splits[0]).DefaultCastAs(LogicalType::LIST(LogicalType::VARCHAR));
		for (auto &param : ListValue::GetChildren(parameters)) {
			arguments.push_back(DBConfig::ParseLogicalType(param.GetValue<string>()));
		}
		if (entry.type != CatalogType::SCALAR_FUNCTION_ENTRY) {
			throw InternalException(
			    "Extension function overloads only supported for scalar functions currently - %s has a different type",
			    entry.name);
		}

		ScalarFunction function(entry.name, std::move(arguments), std::move(return_type), nullptr,
		                        BindExtensionFunction);
		function.function_info = make_shared_ptr<ExtensionFunctionInfo>(entry.extension);
		if (current_set.name != entry.name) {
			if (!current_set.name.empty()) {
				// create set of functions
				AddExtensionFunction(current_set);
			}
			current_set = ScalarFunctionSet(entry.name);
		}
		// add this function to the set of function overloads
		current_set.AddFunction(std::move(function));
	}
	AddExtensionFunction(std::move(current_set));
}